

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O3

QRect __thiscall QListModeViewBase::mapToViewport(QListModeViewBase *this,QRect *rect)

{
  uint uVar1;
  int iVar2;
  QListViewPrivate *pQVar3;
  ulong uVar4;
  QWidgetData *pQVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  QRect QVar11;
  
  pQVar3 = (this->super_QCommonListViewBase).dd;
  uVar6._0_4_ = rect->x1;
  uVar6._4_4_ = rect->y1;
  if (pQVar3->wrap == true) {
    uVar9 = uVar6 >> 0x20;
    uVar7._0_4_ = rect->x2;
    uVar7._4_4_ = rect->y2;
  }
  else {
    uVar4._0_4_ = rect->x2;
    uVar4._4_4_ = rect->y2;
    uVar9 = uVar6 >> 0x20;
    if (pQVar3->flow == TopToBottom) {
      iVar8 = (undefined4)uVar4 - (undefined4)uVar6;
      uVar1 = pQVar3->space;
      uVar6 = (ulong)uVar1;
      iVar8 = iVar8 + 1;
      iVar2 = (this->super_QCommonListViewBase).contentsSize.wd.m_i;
      pQVar5 = ((pQVar3->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)
               ->data;
      iVar10 = ((pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i) + 1;
      if (iVar10 < iVar2) {
        iVar10 = iVar2;
      }
      iVar10 = iVar10 + uVar1 * -2;
      if (iVar10 < iVar8) {
        iVar10 = iVar8;
      }
      uVar7 = uVar4 & 0xffffffff00000000 | (ulong)((uVar1 + iVar10) - 1);
    }
    else {
      uVar1 = pQVar3->space;
      uVar9 = (ulong)uVar1;
      iVar8 = (uVar4._4_4_ - uVar6._4_4_) + 1;
      iVar2 = (this->super_QCommonListViewBase).contentsSize.ht.m_i;
      pQVar5 = ((pQVar3->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)
               ->data;
      iVar10 = ((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1;
      if (iVar10 < iVar2) {
        iVar10 = iVar2;
      }
      iVar10 = iVar10 + uVar1 * -2;
      if (iVar10 < iVar8) {
        iVar10 = iVar8;
      }
      uVar7 = uVar4 & 0xffffffff | (ulong)((uVar1 + iVar10) - 1) << 0x20;
    }
  }
  QVar11._0_8_ = uVar6 & 0xffffffff | uVar9 << 0x20;
  QVar11.x2.m_i = (int)uVar7;
  QVar11.y2.m_i = (int)(uVar7 >> 0x20);
  return QVar11;
}

Assistant:

inline bool QCommonListViewBase::isWrapping() const { return dd->isWrapping(); }